

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::UnsafeArenaSetAllocatedMessage
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor,
          MessageLite *message)

{
  Extension *pEVar1;
  string *psVar2;
  size_type sVar3;
  undefined8 uVar4;
  pointer pcVar5;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar6;
  anon_enum_32 local_3c;
  anon_enum_32 local_38 [4];
  
  if (message == (MessageLite *)0x0) {
    ClearExtension(this,number);
    return;
  }
  pVar6 = Insert(this,number);
  pEVar1 = pVar6.first;
  pEVar1->descriptor = descriptor;
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pEVar1->type = type;
    local_38[0] = anon_unknown_58::cpp_type(type);
    local_3c = 10;
    psVar2 = absl::lts_20240722::log_internal::
             Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                       (local_38,&local_3c,
                        "cpp_type(extension->type) == WireFormatLite::CPPTYPE_MESSAGE");
    if (psVar2 != (string *)0x0) {
      pcVar5 = (psVar2->_M_dataplus)._M_p;
      sVar3 = psVar2->_M_string_length;
      uVar4 = 0x2e7;
      goto LAB_00130f73;
    }
    pEVar1->is_repeated = false;
    pEVar1->field_0xa = (pEVar1->field_0xa & 0xfa) + 1;
LAB_00130f15:
    pEVar1->field_0 = (anon_union_8_9_fdc4a54a_for_Extension_0)message;
LAB_00130f29:
    pEVar1->field_0xa = pEVar1->field_0xa & 0xfd;
    return;
  }
  local_38[0] = pEVar1->is_repeated ^ OPTIONAL_FIELD;
  local_3c = OPTIONAL_FIELD;
  psVar2 = absl::lts_20240722::log_internal::
           Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                     (local_38,&local_3c,
                      "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                     );
  if (psVar2 == (string *)0x0) {
    local_38[0] = anon_unknown_58::cpp_type(pEVar1->type);
    local_3c = 10;
    psVar2 = absl::lts_20240722::log_internal::
             Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                       (local_38,&local_3c,
                        "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
    if (psVar2 == (string *)0x0) {
      if ((pEVar1->field_0xa & 4) != 0) {
        (**(code **)(**(long **)&(pEVar1->field_0).int32_t_value + 0x38))
                  (*(long **)&(pEVar1->field_0).int32_t_value,message,this->arena_);
        goto LAB_00130f29;
      }
      if ((this->arena_ == (Arena *)0x0) && ((long *)(pEVar1->field_0).int64_t_value != (long *)0x0)
         ) {
        (**(code **)(*(long *)(pEVar1->field_0).int64_t_value + 8))();
      }
      goto LAB_00130f15;
    }
  }
  pcVar5 = (psVar2->_M_dataplus)._M_p;
  sVar3 = psVar2->_M_string_length;
  uVar4 = 0x2ed;
LAB_00130f73:
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
             ,uVar4,sVar3,pcVar5);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_38);
}

Assistant:

void ExtensionSet::UnsafeArenaSetAllocatedMessage(
    int number, FieldType type, const FieldDescriptor* descriptor,
    MessageLite* message) {
  if (message == nullptr) {
    ClearExtension(number);
    return;
  }
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_pointer = true;
    extension->is_lazy = false;
    extension->ptr.message_value = message;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    if (extension->is_lazy) {
      extension->ptr.lazymessage_value->UnsafeArenaSetAllocatedMessage(message,
                                                                       arena_);
    } else {
      if (arena_ == nullptr) {
        delete extension->ptr.message_value;
      }
      extension->ptr.message_value = message;
    }
  }
  extension->is_cleared = false;
}